

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void fallbackQSort3(UInt32 *fmap,UInt32 *eclass,Int32 loSt,Int32 hiSt)

{
  UInt32 UVar1;
  UInt32 *in_RSI;
  UInt32 *in_RDI;
  Int32 zztmp_4;
  Int32 yyn_1;
  Int32 yyp2_1;
  Int32 yyp1_1;
  Int32 zztmp_3;
  Int32 yyn;
  Int32 yyp2;
  Int32 yyp1;
  Int32 zztmp_2;
  Int32 zztmp_1;
  Int32 zztmp;
  Int32 stackHi [100];
  Int32 stackLo [100];
  UInt32 r3;
  UInt32 r;
  UInt32 med;
  Int32 hi;
  Int32 lo;
  Int32 sp;
  Int32 m;
  Int32 n;
  Int32 gtHi;
  Int32 ltLo;
  Int32 unHi;
  Int32 unLo;
  int local_39c;
  int local_398;
  int local_390;
  int local_38c;
  int local_388;
  int local_380;
  int local_37c;
  int local_378;
  int aiStack_368 [100];
  int aiStack_1d8 [100];
  uint local_48;
  uint local_44;
  UInt32 local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  UInt32 *local_10;
  UInt32 *local_8;
  
  local_44 = 0;
  local_34 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    while( true ) {
      if (local_34 < 1) {
        return;
      }
      if (0x62 < local_34) {
        bz_internal_error(0x3ec);
      }
      local_34 = local_34 + -1;
      local_38 = aiStack_1d8[local_34];
      local_3c = aiStack_368[local_34];
      if (9 < local_3c - local_38) break;
      fallbackSimpleSort(local_8,local_10,local_38,local_3c);
    }
    local_44 = local_44 * 0x1dc5 + 1 & 0x7fff;
    local_48 = local_44 % 3;
    if (local_48 == 0) {
      local_40 = local_10[local_8[local_38]];
    }
    else if (local_48 == 1) {
      local_40 = local_10[local_8[local_38 + local_3c >> 1]];
    }
    else {
      local_40 = local_10[local_8[local_3c]];
    }
    local_24 = local_38;
    local_1c = local_38;
    local_28 = local_3c;
    local_20 = local_3c;
LAB_00115fad:
    while (local_1c <= local_20) {
      local_2c = local_10[local_8[local_1c]] - local_40;
      if (local_2c == 0) {
        UVar1 = local_8[local_1c];
        local_8[local_1c] = local_8[local_24];
        local_8[local_24] = UVar1;
        local_24 = local_24 + 1;
        local_1c = local_1c + 1;
      }
      else {
        if (0 < local_2c) break;
        local_1c = local_1c + 1;
      }
    }
    while (local_1c <= local_20) {
      local_2c = local_10[local_8[local_20]] - local_40;
      if (local_2c == 0) {
        UVar1 = local_8[local_20];
        local_8[local_20] = local_8[local_28];
        local_8[local_28] = UVar1;
        local_28 = local_28 + -1;
        local_20 = local_20 + -1;
      }
      else {
        if (local_2c < 0) break;
        local_20 = local_20 + -1;
      }
    }
    if (local_1c <= local_20) {
      UVar1 = local_8[local_1c];
      local_8[local_1c] = local_8[local_20];
      local_8[local_20] = UVar1;
      local_1c = local_1c + 1;
      local_20 = local_20 + -1;
      goto LAB_00115fad;
    }
    if (local_24 <= local_28) {
      if (local_24 - local_38 < local_1c - local_24) {
        local_398 = local_24 - local_38;
      }
      else {
        local_398 = local_1c - local_24;
      }
      local_37c = local_1c - local_398;
      local_378 = local_38;
      for (local_380 = local_398; 0 < local_380; local_380 = local_380 + -1) {
        UVar1 = local_8[local_378];
        local_8[local_378] = local_8[local_37c];
        local_8[local_37c] = UVar1;
        local_378 = local_378 + 1;
        local_37c = local_37c + 1;
      }
      if (local_3c - local_28 < local_28 - local_20) {
        local_39c = local_3c - local_28;
      }
      else {
        local_39c = local_28 - local_20;
      }
      local_388 = local_1c;
      local_38c = local_3c - local_39c;
      for (local_390 = local_39c; local_38c = local_38c + 1, 0 < local_390;
          local_390 = local_390 + -1) {
        UVar1 = local_8[local_388];
        local_8[local_388] = local_8[local_38c];
        local_8[local_38c] = UVar1;
        local_388 = local_388 + 1;
      }
      local_2c = ((local_38 + local_1c) - local_24) + -1;
      local_30 = (local_3c - (local_28 - local_20)) + 1;
      if (local_3c - local_30 < local_2c - local_38) {
        aiStack_1d8[local_34] = local_38;
        aiStack_368[local_34] = local_2c;
        local_34 = local_34 + 1;
        aiStack_1d8[local_34] = local_30;
        aiStack_368[local_34] = local_3c;
      }
      else {
        aiStack_1d8[local_34] = local_30;
        aiStack_368[local_34] = local_3c;
        local_34 = local_34 + 1;
        aiStack_1d8[local_34] = local_38;
        aiStack_368[local_34] = local_2c;
      }
      local_34 = local_34 + 1;
    }
  } while( true );
}

Assistant:

static
void fallbackQSort3 ( UInt32* fmap, 
                      UInt32* eclass,
                      Int32   loSt, 
                      Int32   hiSt )
{
   Int32 unLo, unHi, ltLo, gtHi, n, m;
   Int32 sp, lo, hi;
   UInt32 med, r, r3;
   Int32 stackLo[FALLBACK_QSORT_STACK_SIZE];
   Int32 stackHi[FALLBACK_QSORT_STACK_SIZE];

   r = 0;

   sp = 0;
   fpush ( loSt, hiSt );

   while (sp > 0) {

      AssertH ( sp < FALLBACK_QSORT_STACK_SIZE - 1, 1004 );

      fpop ( lo, hi );
      if (hi - lo < FALLBACK_QSORT_SMALL_THRESH) {
         fallbackSimpleSort ( fmap, eclass, lo, hi );
         continue;
      }

      /* Random partitioning.  Median of 3 sometimes fails to
         avoid bad cases.  Median of 9 seems to help but 
         looks rather expensive.  This too seems to work but
         is cheaper.  Guidance for the magic constants 
         7621 and 32768 is taken from Sedgewick's algorithms
         book, chapter 35.
      */
      r = ((r * 7621) + 1) % 32768;
      r3 = r % 3;
      if (r3 == 0) med = eclass[fmap[lo]]; else
      if (r3 == 1) med = eclass[fmap[(lo+hi)>>1]]; else
                   med = eclass[fmap[hi]];

      unLo = ltLo = lo;
      unHi = gtHi = hi;

      while (1) {
         while (1) {
            if (unLo > unHi) break;
            n = (Int32)eclass[fmap[unLo]] - (Int32)med;
            if (n == 0) { 
               fswap(fmap[unLo], fmap[ltLo]); 
               ltLo++; unLo++; 
               continue; 
            };
            if (n > 0) break;
            unLo++;
         }
         while (1) {
            if (unLo > unHi) break;
            n = (Int32)eclass[fmap[unHi]] - (Int32)med;
            if (n == 0) { 
               fswap(fmap[unHi], fmap[gtHi]); 
               gtHi--; unHi--; 
               continue; 
            };
            if (n < 0) break;
            unHi--;
         }
         if (unLo > unHi) break;
         fswap(fmap[unLo], fmap[unHi]); unLo++; unHi--;
      }

      AssertD ( unHi == unLo-1, "fallbackQSort3(2)" );

      if (gtHi < ltLo) continue;

      n = fmin(ltLo-lo, unLo-ltLo); fvswap(lo, unLo-n, n);
      m = fmin(hi-gtHi, gtHi-unHi); fvswap(unLo, hi-m+1, m);

      n = lo + unLo - ltLo - 1;
      m = hi - (gtHi - unHi) + 1;

      if (n - lo > hi - m) {
         fpush ( lo, n );
         fpush ( m, hi );
      } else {
         fpush ( m, hi );
         fpush ( lo, n );
      }
   }
}